

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_bilinear.h
# Opt level: O0

void ncnn::linear_coeffs(int w,int outw,int *xofs,float *alpha,int align_corner)

{
  double dVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  int sx;
  float fx;
  int dx;
  double scale;
  int align_corner_local;
  float *alpha_local;
  int *xofs_local;
  int outw_local;
  int w_local;
  
  scale = (double)w / (double)outw;
  if (align_corner != 0) {
    scale = (double)(w + -1) / (double)(outw + -1);
  }
  for (dx = 0; dx < outw; dx = dx + 1) {
    dVar1 = ((double)dx + 0.5) * scale;
    fx = (float)(dVar1 - 0.5);
    uVar2 = CONCAT44((int)((ulong)dVar1 >> 0x20),fx);
    if (align_corner != 0) {
      fx = (float)((double)dx * scale);
      uVar2 = CONCAT44((int)((ulong)(double)dx >> 0x20),fx);
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar2;
    auVar3 = vroundss_avx(auVar3,ZEXT416((uint)fx),9);
    sx = (int)auVar3._0_4_;
    fx = fx - (float)sx;
    if (sx < 0) {
      sx = 0;
      fx = 0.0;
    }
    if (w + -1 <= sx) {
      sx = w + -2;
      fx = 1.0;
    }
    xofs[dx] = sx;
    alpha[dx << 1] = 1.0 - fx;
    alpha[dx * 2 + 1] = fx;
  }
  return;
}

Assistant:

static void linear_coeffs(int w, int outw, int* xofs, float* alpha, int align_corner)
{
    double scale = (double)w / outw;
    if (align_corner)
    {
        scale = (double)(w - 1) / (outw - 1);
    }

    for (int dx = 0; dx < outw; dx++)
    {
        float fx = (float)((dx + 0.5) * scale - 0.5);
        if (align_corner)
        {
            fx = (float)(dx * scale);
        }

        int sx = (int)floorf(fx);
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= w - 1)
        {
            sx = w - 2;
            fx = 1.f;
        }

        xofs[dx] = sx;

        alpha[dx * 2] = 1.f - fx;
        alpha[dx * 2 + 1] = fx;
    }
}